

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

void __thiscall
OpenMD::
OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
::OrParamConstraint(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                    *this,OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
                          *cons1,EqualIgnoreCaseConstraint *cons2)

{
  pointer pcVar1;
  ostream *poVar2;
  stringstream iss;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  (this->
  super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  ).description_._M_dataplus._M_p =
       (pointer)&(this->
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                 ).description_.field_2;
  (this->
  super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  ).description_._M_string_length = 0;
  (this->
  super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
  ).description_.field_2._M_local_buf[0] = '\0';
  OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
  ::OrParamConstraint(&this->cons1_,cons1);
  (this->cons2_).super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
  _M_dataplus._M_p =
       (pointer)&(this->cons2_).super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_.field_2;
  pcVar1 = (cons2->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).description_.
           _M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->cons2_,pcVar1,
             pcVar1 + (cons2->super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>).
                      description_._M_string_length);
  (this->cons2_).rhs_._M_dataplus._M_p = (pointer)&(this->cons2_).rhs_.field_2;
  pcVar1 = (cons2->rhs_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->cons2_).rhs_,pcVar1,pcVar1 + (cons2->rhs_)._M_string_length);
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar1 = (this->cons1_).
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p;
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar1,
             pcVar1 + (this->cons1_).
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_1f8,local_1f0)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," or ",4);
  pcVar1 = (this->cons2_).super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p;
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,pcVar1,
             pcVar1 + (this->cons2_).super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_1d8,local_1d0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"",0);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)&local_1f8);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

OrParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << cons1_.getConstraintDescription() << " or "
          << cons2_.getConstraintDescription() << "";
      this->description_ = iss.str();
    }